

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::details::file_helper::split_by_extension(filename_t *fname)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type folder_index;
  size_type ext_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  pbVar2 = in_RDI;
  local_10 = in_RSI;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                   (in_stack_ffffffffffffff38,(char)((ulong)in_stack_ffffffffffffff30 >> 0x38),
                    (size_type)in_stack_ffffffffffffff28);
  local_18 = this;
  if (((this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) &&
      (this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
     (sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(local_10),
     this != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - 1))) {
    local_50 = (undefined1 *)
               CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find_last_of(pbVar2,(char *)this,(size_type)in_stack_ffffffffffffff30);
    if ((local_50 != (undefined1 *)0xffffffffffffffff) &&
       ((undefined1 *)((long)&local_18[-1].field_2 + 0xfU) <= local_50)) {
      pbVar2 = &local_70;
      std::__cxx11::string::string(in_stack_ffffffffffffff30);
      std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
                (in_stack_ffffffffffffff28,pbVar2);
      std::__cxx11::string::~string(pbVar2);
      return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (this,(size_type)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (this,(size_type)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    std::make_tuple<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
    return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_RDI;
  }
  std::__cxx11::string::string(&local_38);
  std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
            (local_10,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(in_stack_ffffffffffffff20);
  return (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_RDI;
}

Assistant:

SPDLOG_INLINE std::tuple<filename_t, filename_t> file_helper::split_by_extension(
    const filename_t &fname) {
    auto ext_index = fname.rfind('.');

    // no valid extension found - return whole path and empty string as
    // extension
    if (ext_index == filename_t::npos || ext_index == 0 || ext_index == fname.size() - 1) {
        return std::make_tuple(fname, filename_t());
    }

    // treat cases like "/etc/rc.d/somelogfile or "/abc/.hiddenfile"
    auto folder_index = fname.find_last_of(details::os::folder_seps_filename);
    if (folder_index != filename_t::npos && folder_index >= ext_index - 1) {
        return std::make_tuple(fname, filename_t());
    }

    // finally - return a valid base and extension tuple
    return std::make_tuple(fname.substr(0, ext_index), fname.substr(ext_index));
}